

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.c
# Opt level: O1

int main(void)

{
  float fVar1;
  int iVar2;
  int extraout_EAX;
  byte bVar3;
  byte bVar4;
  uint class_size;
  int iVar5;
  float *actual_factor;
  uint i;
  int extraout_EDX;
  long lVar6;
  undefined1 *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  small_class *sc_00;
  uint j;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  float fVar18;
  float __x;
  double dVar19;
  float fVar20;
  float fVar21;
  undefined1 local_10a8 [8];
  small_class sc;
  undefined1 local_1068 [4100];
  float local_64;
  double local_60;
  undefined1 local_54 [8];
  small_class sc_1;
  
  plan(3);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  uVar15 = 1;
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","test_class");
  small_class_create((small_class *)local_10a8,2,1.2,0xc,(float *)local_54);
  sc_00 = (small_class *)(ulong)sc.effective_bits;
  uVar14 = 0;
  if (sc.granularity == 0) {
    uVar14 = sc.ignore_bits_count;
  }
  bVar3 = (byte)local_10a8._4_4_;
  uVar11 = ((uVar14 | sc.effective_bits & 1) << (bVar3 & 0x1f)) + sc.effective_size;
  uVar14 = 0;
  do {
    uVar13 = uVar15 - sc.effective_mask;
    if (uVar15 < sc.effective_mask) {
      uVar13 = 0;
    }
    uVar13 = uVar13 >> (bVar3 & 0x1f);
    bVar4 = (byte)sc.granularity;
    uVar8 = uVar13 >> (bVar4 & 0x1f) | 1;
    iVar5 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    actual_factor = (float *)(ulong)sc.granularity;
    uVar13 = (iVar5 << (bVar4 & 0x1f)) + (uVar13 >> ((byte)iVar5 & 0x1f));
    if ((uVar15 <= uVar11) && (uVar13 != uVar14)) goto LAB_00101ab2;
    actual_factor = (float *)(ulong)(uVar11 + 1);
    if (uVar15 == uVar11 + 1) {
      if (uVar13 != uVar14 + 1) goto LAB_00101ab7;
      uVar11 = uVar13 + 1;
      uVar8 = uVar11 >> (bVar4 & 0x1f);
      uVar14 = uVar8;
      if (uVar11 >> (bVar4 & 0x1f) != 0) {
        uVar14 = sc.ignore_bits_count;
      }
      bVar4 = 0;
      if (uVar8 != 0) {
        bVar4 = (char)uVar8 - 1;
      }
      uVar11 = (((uVar14 | uVar11 & sc.effective_bits) << (bVar4 & 0x1f)) << (bVar3 & 0x1f)) +
               sc.effective_size;
      uVar14 = uVar13;
    }
    uVar15 = uVar15 + 1;
    if (uVar15 == 0x65) {
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_class.c",
          0x3e,"line %d",0x3e);
      _space(_stdout);
      printf("# *** %s: done ***\n","test_class");
      check_plan();
      plan(4);
      _space(_stdout);
      printf("# *** %s ***\n","check_expectation");
      lVar16 = 0;
      do {
        uVar14 = (&DAT_00102210)[lVar16];
        iVar2 = rand();
        lVar6 = 0;
        iVar5 = iVar2 % 0x10;
        do {
          iVar5 = iVar5 + uVar14;
          *(int *)(local_10a8 + lVar6 * 4) = iVar5;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x10);
        puVar7 = local_1068;
        uVar12 = 0x10;
        uVar15 = uVar14;
        do {
          lVar6 = 0;
          do {
            iVar5 = iVar5 + uVar15;
            *(int *)(puVar7 + lVar6 * 4) = iVar5;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
          uVar15 = uVar15 * 2;
          puVar7 = puVar7 + 0x40;
          bVar17 = uVar12 < 0x3f0;
          uVar12 = uVar12 + 0x10;
        } while (bVar17);
        small_class_create((small_class *)local_54,uVar14,1.05,iVar2 % 0x10 + uVar14,&local_64);
        uVar14 = 0;
        _ok((uint)(sc_1.ignore_bits_count == 0x10),"sc.effective_size == eff_size",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_class.c"
            ,0x71,"line %d",0x71);
        sc_00 = (small_class *)(ulong)sc_1.effective_mask;
        do {
          uVar12 = 0;
          do {
            if (uVar14 <= *(uint *)(local_10a8 + uVar12 * 4)) goto LAB_0010178d;
            uVar12 = uVar12 + 1;
          } while (uVar12 != 0x400);
          uVar12 = 0x400;
LAB_0010178d:
          uVar15 = uVar14 - sc_1.effective_mask;
          if (uVar14 < sc_1.effective_mask) {
            uVar15 = 0;
          }
          uVar15 = uVar15 >> ((byte)local_54._4_4_ & 0x1f);
          bVar3 = (byte)sc_1.granularity;
          uVar11 = uVar15 >> (bVar3 & 0x1f) | 1;
          iVar5 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          actual_factor = (float *)(ulong)sc_1.granularity;
          uVar13 = (iVar5 << (bVar3 & 0x1f)) + (uVar15 >> ((byte)iVar5 & 0x1f));
          if (uVar13 != (uint)uVar12) {
            main_cold_3();
LAB_00101aa3:
            main_cold_4();
            goto LAB_00101aa8;
          }
          uVar11 = uVar13 + 1;
          uVar8 = uVar11 >> (bVar3 & 0x1f);
          uVar15 = sc_1.ignore_bits_count;
          if (uVar11 >> (bVar3 & 0x1f) == 0) {
            uVar15 = uVar8;
          }
          uVar13 = uVar8 - 1;
          if (uVar8 == 0) {
            uVar13 = 0;
          }
          actual_factor = (float *)(uVar12 & 0xffffffff);
          if ((((uVar15 | uVar11 & sc_1.effective_bits) << ((byte)uVar13 & 0x1f)) <<
              ((byte)local_54._4_4_ & 0x1f)) + sc_1.effective_size !=
              *(int *)(local_10a8 + (long)actual_factor * 4)) goto LAB_00101aa3;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 0x401);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      _space(_stdout);
      printf("# *** %s: done ***\n","check_expectation");
      check_plan();
      plan(1);
      _space(_stdout);
      printf("# *** %s ***\n","check_factor");
      uVar14 = 1;
      do {
        dVar19 = 1.0099999904632568;
        fVar20 = 1.01;
        do {
          sc_00 = (small_class *)local_10a8;
          actual_factor = (float *)local_54;
          local_60 = dVar19;
          sc_1.size_shift_plus_1 = (uint)fVar20;
          uVar13 = uVar14;
          small_class_create(sc_00,uVar14,fVar20,uVar14,actual_factor);
          fVar20 = powf((float)sc_1.size_shift_plus_1,0.5);
          if (((float)sc.size_shift < (float)sc_1.size_shift_plus_1 / fVar20) ||
             ((float)sc_1.size_shift_plus_1 * fVar20 < (float)sc.size_shift)) goto LAB_00101aa8;
          if (sc.ignore_bits_count < sc.ignore_bits_count * 3) {
            uVar15 = sc.ignore_bits_count + 2;
            iVar5 = sc.ignore_bits_count * 2;
            fVar18 = 1.0;
            fVar20 = 1.0;
            do {
              uVar11 = uVar15 - 1;
              bVar3 = (byte)sc.granularity & 0x1f;
              uVar13 = uVar11 >> bVar3;
              uVar8 = sc.ignore_bits_count;
              if (uVar11 >> bVar3 == 0) {
                uVar8 = uVar13;
              }
              bVar3 = (char)uVar13 - 1;
              if (uVar13 == 0) {
                bVar3 = 0;
              }
              bVar4 = (byte)sc.granularity & 0x1f;
              uVar9 = uVar15 >> bVar4;
              uVar10 = sc.ignore_bits_count;
              if (uVar15 >> bVar4 == 0) {
                uVar10 = uVar9;
              }
              uVar13 = uVar9 - 1;
              if (uVar9 == 0) {
                uVar13 = 0;
              }
              actual_factor = (float *)(ulong)(uint)local_10a8._4_4_;
              sc_00 = (small_class *)
                      (ulong)((((uVar10 | uVar15 & sc.effective_bits) << ((byte)uVar13 & 0x1f)) <<
                              ((byte)local_10a8._4_4_ & 0x1f)) + sc.effective_size);
              fVar21 = (float)sc.size_shift /
                       ((float)(long)sc_00 /
                       (float)((((uVar8 | uVar11 & sc.effective_bits) << (bVar3 & 0x1f)) <<
                               ((byte)local_10a8._4_4_ & 0x1f)) + sc.effective_size));
              fVar1 = fVar21;
              if (fVar18 <= fVar21) {
                fVar1 = fVar18;
              }
              fVar18 = fVar1;
              if (fVar21 <= fVar20) {
                fVar21 = fVar20;
              }
              uVar15 = uVar15 + 1;
              iVar5 = iVar5 + -1;
              fVar20 = fVar21;
            } while (iVar5 != 0);
            if ((fVar18 <= 0.6931472) || (1.3862944 <= fVar21)) goto LAB_00101aad;
          }
          fVar20 = (float)(local_60 + 0.01);
          dVar19 = (double)fVar20;
        } while (dVar19 < 1.995);
        bVar17 = 1 < uVar14;
        uVar14 = uVar14 * 4;
        if (bVar17) {
          _ok(1,"true",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_class.c"
              ,0xa2,"line %d",0xa2);
          _space(_stdout);
          printf("# *** %s: done ***\n","check_factor");
          check_plan();
          _space(_stdout);
          printf("# *** %s: done ***\n","main");
          iVar5 = check_plan();
          return iVar5;
        }
      } while( true );
    }
  } while( true );
LAB_00101aa8:
  main_cold_6();
LAB_00101aad:
  main_cold_5();
LAB_00101ab2:
  main_cold_1();
LAB_00101ab7:
  main_cold_2();
  if (uVar13 == 0) {
    __assert_fail("granularity > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x29,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  if ((uVar13 & uVar13 - 1) != 0) {
    __assert_fail("(granularity & (granularity - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x2a,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  if (__x <= 1.0) {
    __assert_fail("desired_factor > 1.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x2b,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  if (__x <= 2.0) {
    if (extraout_EDX == 0) {
      __assert_fail("min_alloc > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                    ,0x2d,
                    "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                   );
    }
    if (actual_factor != (float *)0x0) {
      sc_00->granularity = uVar13;
      uVar14 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      sc_00->ignore_bits_count = uVar14;
      fVar20 = logf(__x);
      fVar20 = logf(0.6931472 / fVar20);
      uVar12 = (ulong)(fVar20 / 0.6931472 + 0.5);
      uVar14 = 1 << ((byte)uVar12 & 0x1f);
      sc_00->effective_bits = (uint)uVar12;
      sc_00->effective_size = uVar14;
      sc_00->effective_mask = uVar14 - 1;
      sc_00->size_shift = extraout_EDX - uVar13;
      sc_00->size_shift_plus_1 = (extraout_EDX - uVar13) + 1;
      fVar20 = exp2f((float)(uVar12 & 0xffffffff));
      fVar20 = exp2f(1.0 / fVar20);
      sc_00->actual_factor = fVar20;
      *actual_factor = fVar20;
      return extraout_EAX;
    }
    __assert_fail("actual_factor != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                  ,0x2e,
                  "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
                 );
  }
  __assert_fail("desired_factor <= 2.f",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small_class.c"
                ,0x2c,
                "void small_class_create(struct small_class *, unsigned int, float, unsigned int, float *)"
               );
}

Assistant:

int
main(void)
{
	plan(3);
	header();

	test_class();
	check_expectation();
	check_factor();

	footer();
	return check_plan();
}